

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

CURLcode mqtt_doing(Curl_easy *data,_Bool *done)

{
  uint *puVar1;
  smb_conn_state sVar2;
  curl_socket_t sockfd_00;
  uint uVar3;
  MQTT *pMVar4;
  SMTP *pSVar5;
  _Bool *p_Var6;
  byte bVar7;
  CURLcode CVar8;
  CURLcode CVar9;
  int iVar10;
  size_t len;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  curl_slist *sizerequested;
  uchar encoded;
  size_t __n;
  connectdata *pcVar14;
  long lVar15;
  ulong uVar16;
  curl_socket_t sockfd;
  connectdata *conn;
  curl_slist *size;
  size_t sVar17;
  bool bVar18;
  uchar byte;
  byte bStack_67;
  char cStack_66;
  undefined5 uStack_65;
  ssize_t nread;
  char local_54 [4];
  Curl_easy *local_50;
  connectdata *local_48;
  _Bool *local_40;
  curl_socket_t local_34;
  
  pcVar14 = data->conn;
  pMVar4 = (data->req).p.mqtt;
  local_34 = pcVar14->sock[0];
  pcVar12 = (data->state).buffer;
  *done = false;
  if (pMVar4->nsend != 0) {
    pcVar13 = pMVar4->sendleftovers;
    local_40 = done;
    CVar8 = mqtt_send(data,pcVar13,pMVar4->nsend);
    done = local_40;
    (*Curl_cfree)(pcVar13);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
  }
  Curl_infof(data,"mqtt_doing: state [%d]",(ulong)(pcVar14->proto).smbc.state);
  local_48 = pcVar14;
  local_50 = data;
  switch((pcVar14->proto).smbc.state) {
  case SMB_NOT_CONNECTED:
    local_40 = done;
    CVar8 = Curl_read(data,local_34,(char *)&pMVar4->firstbyte,1,&nread);
    if (nread == 0) break;
    Curl_debug(data,CURLINFO_HEADER_IN,(char *)&pMVar4->firstbyte,1);
    pMVar4->npacket = 0;
    (data->conn->proto).smbc.state = SMB_CONNECTING;
    done = local_40;
  case SMB_CONNECTING:
    lVar15 = 1;
    local_40 = done;
    do {
      CVar9 = Curl_read(data,local_34,(char *)&byte,1,&nread);
      if (nread == 0) {
        bVar18 = true;
        goto LAB_0012e083;
      }
      Curl_debug(data,CURLINFO_HEADER_IN,(char *)&byte,1);
      sVar17 = pMVar4->npacket;
      pMVar4->npacket = sVar17 + 1;
      pcVar12[sVar17] = byte;
    } while (((char)byte < '\0') && (pMVar4->npacket < 4));
    bVar18 = nread == 0;
LAB_0012e083:
    p_Var6 = local_40;
    CVar8 = CURLE_WEIRD_SERVER_REPLY;
    if (-1 < (char)byte) {
      CVar8 = CVar9;
    }
    if (bVar18) {
      CVar8 = CVar9;
    }
    if (CVar8 == CURLE_OK) {
      bVar7 = 0x80;
      sVar17 = 0;
      uVar16 = 0;
      while ((uVar16 < pMVar4->npacket && ((char)bVar7 < '\0'))) {
        bVar7 = pcVar12[uVar16];
        sVar17 = sVar17 + (ulong)(bVar7 & 0x7f) * lVar15;
        lVar15 = lVar15 << 7;
        uVar16 = uVar16 + 1;
      }
      pMVar4->remaining_length = sVar17;
      pMVar4->npacket = 0;
      if (sVar17 != 0) {
        sVar2 = (local_48->proto).mqtt.nextstate;
        pcVar14 = local_50->conn;
        (pcVar14->proto).smbc.state = sVar2;
        if (sVar2 != SMB_NOT_CONNECTED) {
          return CURLE_OK;
        }
        (pcVar14->proto).mqtt.nextstate = MQTT_NOSTATE;
        return CURLE_OK;
      }
      (local_50->conn->proto).ftpc.pp.cache = (char *)0x0;
      if (pMVar4->firstbyte != 0xe0) {
        return CURLE_OK;
      }
      Curl_infof(local_50,"Got DISCONNECT");
      *p_Var6 = true;
      return CURLE_OK;
    }
    break;
  case SMB_NEGOTIATE:
    CVar8 = Curl_read(data,data->conn->sock[0],(char *)&byte,2,&nread);
    if (CVar8 != CURLE_OK) break;
    Curl_debug(data,CURLINFO_HEADER_IN,(char *)&byte,nread);
    CVar8 = CURLE_WEIRD_SERVER_REPLY;
    if (nread < 2) break;
    if (byte != '\0' || bStack_67 != 0) {
      Curl_failf(data,"Expected %02x%02x but got %02x%02x",0,0,(ulong)byte,(ulong)bStack_67);
      break;
    }
    if ((data->state).httpreq == HTTPREQ_POST) {
      pcVar12 = (char *)(data->set).postfields;
      nread = 0;
      if (pcVar12 == (char *)0x0) {
        CVar8 = CURLE_BAD_FUNCTION_ARGUMENT;
      }
      else {
        sVar11 = (data->set).postfieldsize;
        if ((long)sVar11 < 0) {
          sVar11 = strlen(pcVar12);
        }
        CVar8 = mqtt_get_topic(data,(char **)&nread,(size_t *)&byte);
        if (CVar8 == CURLE_OK) {
          lVar15 = CONCAT53(uStack_65,CONCAT12(cStack_66,CONCAT11(bStack_67,byte)));
          iVar10 = mqtt_encode_len(local_54,sVar11 + lVar15 + 2);
          __n = (size_t)iVar10;
          pcVar13 = (char *)(*Curl_cmalloc)(__n + sVar11 + lVar15 + 3);
          if (pcVar13 == (char *)0x0) {
            CVar8 = CURLE_OUT_OF_MEMORY;
            goto LAB_0012e301;
          }
          *pcVar13 = '0';
          memcpy(pcVar13 + 1,local_54,__n);
          pcVar13[__n + 1] = bStack_67;
          pcVar13[__n + 2] = byte;
          memcpy(pcVar13 + __n + 3,(void *)nread,
                 CONCAT53(uStack_65,CONCAT12(cStack_66,CONCAT11(bStack_67,byte))));
          lVar15 = __n + 3 + CONCAT53(uStack_65,CONCAT12(cStack_66,CONCAT11(bStack_67,byte)));
          memcpy(pcVar13 + lVar15,pcVar12,sVar11);
          CVar8 = mqtt_send(local_50,pcVar13,lVar15 + sVar11);
        }
        else {
LAB_0012e301:
          pcVar13 = (char *)0x0;
        }
        (*Curl_cfree)(pcVar13);
        (*Curl_cfree)((void *)nread);
        pcVar14 = local_48;
        if (CVar8 == CURLE_OK) {
          CVar8 = mqtt_send(local_50,anon_var_dwarf_b53d8,2);
          *done = true;
        }
      }
      (pcVar14->proto).mqtt.nextstate = MQTT_FIRST;
      break;
    }
    nread = 0;
    pcVar14 = data->conn;
    CVar8 = mqtt_get_topic(data,(char **)&nread,(size_t *)&byte);
    if (CVar8 == CURLE_OK) {
      puVar1 = &(pcVar14->proto).mqtt.packetid;
      *puVar1 = *puVar1 + 1;
      lVar15 = CONCAT53(uStack_65,CONCAT12(cStack_66,CONCAT11(bStack_67,byte)));
      iVar10 = mqtt_encode_len(local_54,lVar15 + 5);
      sVar11 = (size_t)iVar10;
      sVar17 = sVar11 + lVar15 + 6;
      pcVar12 = (char *)(*Curl_cmalloc)(sVar17);
      if (pcVar12 == (char *)0x0) {
        CVar8 = CURLE_OUT_OF_MEMORY;
        goto LAB_0012e34e;
      }
      *pcVar12 = -0x7e;
      memcpy(pcVar12 + 1,local_54,sVar11);
      pcVar12[sVar11 + 1] = *(char *)((long)&pcVar14->proto + 9);
      pcVar12[sVar11 + 2] = *(char *)((long)&pcVar14->proto + 8);
      pcVar12[sVar11 + 3] = bStack_67;
      pcVar12[sVar11 + 4] = byte;
      memcpy(pcVar12 + sVar11 + 5,(void *)nread,
             CONCAT53(uStack_65,CONCAT12(cStack_66,CONCAT11(bStack_67,byte))));
      pcVar12[CONCAT53(uStack_65,CONCAT12(cStack_66,CONCAT11(bStack_67,byte))) + 5 + sVar11] = '\0';
      CVar8 = mqtt_send(data,pcVar12,sVar17);
    }
    else {
LAB_0012e34e:
      pcVar12 = (char *)0x0;
    }
    (*Curl_cfree)((void *)nread);
    (*Curl_cfree)(pcVar12);
    if (CVar8 == CURLE_OK) {
      (data->conn->proto).ftpc.pp.cache = (char *)0x300000000;
      return CURLE_OK;
    }
    break;
  case SMB_SETUP:
  case SMB_CONNECTED|SMB_CONNECTING:
  case SMB_CONNECTED|SMB_NEGOTIATE:
    pcVar14 = data->conn;
    sVar2 = (pcVar14->proto).smbc.state;
    CVar8 = CURLE_WEIRD_SERVER_REPLY;
    if (3 < sVar2 - SMB_SETUP) break;
    sockfd_00 = pcVar14->sock[0];
    pcVar12 = (data->state).buffer;
    pSVar5 = (data->req).p.smtp;
    switch(sVar2) {
    default:
      bVar7 = pSVar5->rcpt_had_ok & 0xf0;
      if (bVar7 == 0xe0) {
        CVar8 = CURLE_OK;
        Curl_infof(data,"Got DISCONNECT");
        *done = true;
        goto LAB_0012e286;
      }
      if (bVar7 == 0x90) {
        (pcVar14->proto).smbc.state = SMB_CONNECTED;
        goto switchD_0012de39_caseD_4;
      }
      if (bVar7 != 0x30) goto LAB_0012e286;
      (pcVar14->proto).smbc.state = SMB_CONNECTED|SMB_NEGOTIATE;
      size = (curl_slist *)pSVar5->eob;
      Curl_infof(data,"Remaining length: %zd bytes",size);
      lVar15 = (data->set).max_filesize;
      if (lVar15 != 0 && lVar15 < (long)size) {
        Curl_failf(data,"Maximum file size exceeded");
        CVar8 = CURLE_FILESIZE_EXCEEDED;
        goto LAB_0012e286;
      }
      Curl_pgrsSetDownloadSize(data,(curl_off_t)size);
      (data->req).bytecount = 0;
      (data->req).size = (curl_off_t)size;
      pSVar5->rcpt = size;
      break;
    case SMB_CONNECTED:
switchD_0012de39_caseD_4:
      CVar8 = Curl_read(data,sockfd_00,(char *)&byte,3,&nread);
      if (CVar8 == CURLE_OK) {
        Curl_debug(data,CURLINFO_HEADER_IN,(char *)&byte,nread);
        CVar8 = CURLE_WEIRD_SERVER_REPLY;
        if ((((2 < nread) && (uVar3 = (pcVar14->proto).mqtt.packetid, byte == (uchar)(uVar3 >> 8)))
            && (bStack_67 == (byte)uVar3)) && (cStack_66 == '\0')) {
          (data->conn->proto).ftpc.pp.cache = (char *)0x500000000;
          CVar8 = CURLE_OK;
        }
      }
      goto LAB_0012e286;
    case SMB_CONNECTED|SMB_NEGOTIATE:
      size = pSVar5->rcpt;
    }
    sizerequested = (curl_slist *)(data->set).buffer_size;
    if (size < sizerequested) {
      sizerequested = size;
    }
    CVar8 = Curl_read(data,sockfd_00,pcVar12,(size_t)sizerequested,&nread);
    if (CVar8 == CURLE_OK) {
      if (nread == 0) {
        Curl_infof(data,"server disconnected");
        CVar8 = CURLE_PARTIAL_FILE;
      }
      else {
        Curl_debug(data,CURLINFO_DATA_IN,pcVar12,nread);
        pSVar5->rcpt = (curl_slist *)((long)pSVar5->rcpt - nread);
        lVar15 = nread + (data->req).bytecount;
        (data->req).bytecount = lVar15;
        Curl_pgrsSetDownloadCounter(data,lVar15);
        CVar8 = Curl_client_write(data,1,pcVar12,nread);
        if ((CVar8 == CURLE_OK) && (CVar8 = CURLE_OK, pSVar5->rcpt == (curl_slist *)0x0)) {
          (data->conn->proto).ftpc.pp.cache = (char *)0x500000000;
        }
      }
    }
    else if (CVar8 == CURLE_AGAIN) {
      Curl_infof(data,"EEEE AAAAGAIN");
      CVar8 = CURLE_AGAIN;
    }
    break;
  default:
    Curl_failf(data,"State not handled yet");
    *done = true;
    return CURLE_OK;
  }
LAB_0012e286:
  CVar9 = CURLE_OK;
  if (CVar8 != CURLE_AGAIN) {
    CVar9 = CVar8;
  }
  return CVar9;
}

Assistant:

static CURLcode mqtt_doing(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = &conn->proto.mqtt;
  struct MQTT *mq = data->req.p.mqtt;
  ssize_t nread;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  unsigned char *pkt = (unsigned char *)data->state.buffer;
  unsigned char byte;

  *done = FALSE;

  if(mq->nsend) {
    /* send the remainder of an outgoing packet */
    char *ptr = mq->sendleftovers;
    result = mqtt_send(data, mq->sendleftovers, mq->nsend);
    free(ptr);
    if(result)
      return result;
  }

  infof(data, "mqtt_doing: state [%d]", (int) mqtt->state);
  switch(mqtt->state) {
  case MQTT_FIRST:
    /* Read the initial byte only */
    result = Curl_read(data, sockfd, (char *)&mq->firstbyte, 1, &nread);
    if(!nread)
      break;
    Curl_debug(data, CURLINFO_HEADER_IN, (char *)&mq->firstbyte, 1);
    /* remember the first byte */
    mq->npacket = 0;
    mqstate(data, MQTT_REMAINING_LENGTH, MQTT_NOSTATE);
    /* FALLTHROUGH */
  case MQTT_REMAINING_LENGTH:
    do {
      result = Curl_read(data, sockfd, (char *)&byte, 1, &nread);
      if(!nread)
        break;
      Curl_debug(data, CURLINFO_HEADER_IN, (char *)&byte, 1);
      pkt[mq->npacket++] = byte;
    } while((byte & 0x80) && (mq->npacket < 4));
    if(nread && (byte & 0x80))
      /* MQTT supports up to 127 * 128^0 + 127 * 128^1 + 127 * 128^2 +
         127 * 128^3 bytes. server tried to send more */
      result = CURLE_WEIRD_SERVER_REPLY;
    if(result)
      break;
    mq->remaining_length = mqtt_decode_len(&pkt[0], mq->npacket, NULL);
    mq->npacket = 0;
    if(mq->remaining_length) {
      mqstate(data, mqtt->nextstate, MQTT_NOSTATE);
      break;
    }
    mqstate(data, MQTT_FIRST, MQTT_FIRST);

    if(mq->firstbyte == MQTT_MSG_DISCONNECT) {
      infof(data, "Got DISCONNECT");
      *done = TRUE;
    }
    break;
  case MQTT_CONNACK:
    result = mqtt_verify_connack(data);
    if(result)
      break;

    if(data->state.httpreq == HTTPREQ_POST) {
      result = mqtt_publish(data);
      if(!result) {
        result = mqtt_disconnect(data);
        *done = TRUE;
      }
      mqtt->nextstate = MQTT_FIRST;
    }
    else {
      result = mqtt_subscribe(data);
      if(!result) {
        mqstate(data, MQTT_FIRST, MQTT_SUBACK);
      }
    }
    break;

  case MQTT_SUBACK:
  case MQTT_PUBWAIT:
  case MQTT_PUB_REMAIN:
    result = mqtt_read_publish(data, done);
    break;

  default:
    failf(data, "State not handled yet");
    *done = TRUE;
    break;
  }

  if(result == CURLE_AGAIN)
    result = CURLE_OK;
  return result;
}